

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ParseCustomMetaValue(AsciiParser *this)

{
  ostream *poVar1;
  ostringstream ss_e;
  string local_1b0;
  ostringstream local_190 [376];
  
  ::std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = ::std::operator<<((ostream *)local_190,"[error]");
  poVar1 = ::std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                            );
  poVar1 = ::std::operator<<(poVar1,":");
  poVar1 = ::std::operator<<(poVar1,"ParseCustomMetaValue");
  poVar1 = ::std::operator<<(poVar1,"():");
  poVar1 = (ostream *)::std::ostream::operator<<(poVar1,0x93c);
  ::std::operator<<(poVar1," ");
  poVar1 = ::std::operator<<((ostream *)local_190,"TODO");
  ::std::operator<<(poVar1,"\n");
  ::std::__cxx11::stringbuf::str();
  PushError(this,&local_1b0);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::ostringstream::~ostringstream(local_190);
  return false;
}

Assistant:

bool AsciiParser::ParseCustomMetaValue() {
  // type identifier '=' value

  // return ParseAttributeMeta();
  PUSH_ERROR_AND_RETURN("TODO");
}